

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_interface.cpp
# Opt level: O3

string * __thiscall
cppcms::session_interface::session_cookie_name_abi_cxx11_
          (string *__return_storage_ptr__,session_interface *this)

{
  pointer pcVar1;
  cached_settings *pcVar2;
  
  pcVar2 = cached_settings(this);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (pcVar2->session).cookies.prefix._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + (pcVar2->session).cookies.prefix._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string session_interface::session_cookie_name()
{
	return cached_settings().session.cookies.prefix;
}